

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::FileDescriptorProto::_InternalSerialize
          (FileDescriptorProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  string *psVar2;
  size_t __n;
  FileOptions *this_00;
  SourceCodeInfo *this_01;
  void *pvVar3;
  int32 iVar4;
  Type *s;
  uint8 *puVar5;
  Type *this_02;
  Type *this_03;
  Type *this_04;
  Type *this_05;
  int iVar6;
  int iVar7;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar2 = (this->name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FileDescriptorProto.name");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,(this->name_).ptr_,target);
  }
  if ((uVar1 & 2) != 0) {
    psVar2 = (this->package_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FileDescriptorProto.package");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,2,(this->package_).ptr_,target)
    ;
  }
  iVar6 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
  iVar7 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar7; iVar7 = iVar7 + 1) {
    s = internal::RepeatedPtrFieldBase::
        Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                  (&(this->dependency_).super_RepeatedPtrFieldBase,iVar7);
    internal::WireFormatLite::VerifyUtf8String
              ((s->_M_dataplus)._M_p,(int)s->_M_string_length,SERIALIZE,
               "google.protobuf.FileDescriptorProto.dependency");
    __n = s->_M_string_length;
    if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)target)))) {
      *target = '\x1a';
      target[1] = (uint8)__n;
      memcpy(target + 2,(s->_M_dataplus)._M_p,__n);
      target = target + __n + 2;
    }
    else {
      target = io::EpsCopyOutputStream::WriteStringOutline(stream,3,s,target);
    }
  }
  iVar6 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar7 = 0; iVar6 != iVar7; iVar7 = iVar7 + 1) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    this_02 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                        (&(this->message_type_).super_RepeatedPtrFieldBase,iVar7);
    *puVar5 = '\"';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_02->_cached_size_).size_.super___atomic_base<int>._M_i,puVar5 + 1);
    target = DescriptorProto::_InternalSerialize(this_02,puVar5,stream);
  }
  iVar6 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar7 = 0; iVar6 != iVar7; iVar7 = iVar7 + 1) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    this_03 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                        (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar7);
    *puVar5 = '*';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_03->_cached_size_).size_.super___atomic_base<int>._M_i,puVar5 + 1);
    target = EnumDescriptorProto::_InternalSerialize(this_03,puVar5,stream);
  }
  iVar6 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar7 = 0; iVar6 != iVar7; iVar7 = iVar7 + 1) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    this_04 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                        (&(this->service_).super_RepeatedPtrFieldBase,iVar7);
    *puVar5 = '2';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_04->_cached_size_).size_.super___atomic_base<int>._M_i,puVar5 + 1);
    target = ServiceDescriptorProto::_InternalSerialize(this_04,puVar5,stream);
  }
  iVar6 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar7 = 0; iVar6 != iVar7; iVar7 = iVar7 + 1) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    this_05 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                        (&(this->extension_).super_RepeatedPtrFieldBase,iVar7);
    *puVar5 = ':';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_05->_cached_size_).size_.super___atomic_base<int>._M_i,puVar5 + 1);
    target = FieldDescriptorProto::_InternalSerialize(this_05,puVar5,stream);
  }
  if ((uVar1 & 8) != 0) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    this_00 = this->options_;
    *puVar5 = 'B';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_00->_cached_size_).size_.super___atomic_base<int>._M_i,puVar5 + 1);
    target = FileOptions::_InternalSerialize(this_00,puVar5,stream);
  }
  if ((uVar1 & 0x10) != 0) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    this_01 = this->source_code_info_;
    *puVar5 = 'J';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_01->_cached_size_).size_.super___atomic_base<int>._M_i,puVar5 + 1);
    target = SourceCodeInfo::_InternalSerialize(this_01,puVar5,stream);
  }
  iVar6 = (this->public_dependency_).current_size_;
  iVar7 = 0;
  if (iVar6 < 1) {
    iVar6 = iVar7;
  }
  for (; iVar6 != iVar7; iVar7 = iVar7 + 1) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    iVar4 = _internal_public_dependency(this,iVar7);
    *puVar5 = 'P';
    target = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar4,puVar5 + 1);
  }
  iVar6 = (this->weak_dependency_).current_size_;
  iVar7 = 0;
  if (iVar6 < 1) {
    iVar6 = iVar7;
  }
  for (; iVar6 != iVar7; iVar7 = iVar7 + 1) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    iVar4 = _internal_weak_dependency(this,iVar7);
    *puVar5 = 'X';
    target = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar4,puVar5 + 1);
  }
  if ((uVar1 & 4) != 0) {
    psVar2 = (this->syntax_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FileDescriptorProto.syntax");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0xc,(this->syntax_).ptr_,target);
  }
  pvVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    puVar5 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 8),target,stream)
    ;
    return puVar5;
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* FileDescriptorProto::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FileDescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // optional string package = 2;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_package().data(), static_cast<int>(this->_internal_package().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.package");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_package(), target);
  }

  // repeated string dependency = 3;
  for (int i = 0, n = this->_internal_dependency_size(); i < n; i++) {
    const auto& s = this->_internal_dependency(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.dependency");
    target = stream->WriteString(3, s, target);
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_message_type_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(4, this->_internal_message_type(i), target, stream);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_enum_type_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(5, this->_internal_enum_type(i), target, stream);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_service_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(6, this->_internal_service(i), target, stream);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_extension_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(7, this->_internal_extension(i), target, stream);
  }

  // optional .google.protobuf.FileOptions options = 8;
  if (cached_has_bits & 0x00000008u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        8, _Internal::options(this), target, stream);
  }

  // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
  if (cached_has_bits & 0x00000010u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        9, _Internal::source_code_info(this), target, stream);
  }

  // repeated int32 public_dependency = 10;
  for (int i = 0, n = this->_internal_public_dependency_size(); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(10, this->_internal_public_dependency(i), target);
  }

  // repeated int32 weak_dependency = 11;
  for (int i = 0, n = this->_internal_weak_dependency_size(); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(11, this->_internal_weak_dependency(i), target);
  }

  // optional string syntax = 12;
  if (cached_has_bits & 0x00000004u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_syntax().data(), static_cast<int>(this->_internal_syntax().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.syntax");
    target = stream->WriteStringMaybeAliased(
        12, this->_internal_syntax(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FileDescriptorProto)
  return target;
}